

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O0

QDebug QtPrivate::printSequentialContainer<QList<QPersistentModelIndex>>
                 (QDebug *debug,char *which,QList<QPersistentModelIndex> *c)

{
  bool bVar1;
  QDebug *this;
  QPersistentModelIndex *in_RCX;
  QDebug *in_RDX;
  QDebugStateSaver *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  const_iterator end;
  const_iterator it;
  QDebugStateSaver saver;
  char in_stack_ffffffffffffff4f;
  QList<QPersistentModelIndex> *in_stack_ffffffffffffff50;
  QDebug *in_stack_ffffffffffffff58;
  Stream *pSVar2;
  QDebug *in_stack_ffffffffffffff78;
  Stream *t;
  QDebug local_50 [2];
  QPersistentModelIndex *local_40;
  QDebug local_38 [2];
  QPersistentModelIndex *local_28;
  const_iterator local_20;
  const_iterator local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  pSVar2 = in_RDI;
  t = in_RDI;
  QDebugStateSaver::QDebugStateSaver(in_RSI,(QDebug *)in_RDI);
  QDebug::nospace((QDebug *)in_RSI);
  this = QDebug::operator<<(in_stack_ffffffffffffff78,(char *)t);
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4f);
  local_18.i = (QPersistentModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = QList<QPersistentModelIndex>::begin(in_stack_ffffffffffffff50);
  local_20.i = (QPersistentModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = (QPersistentModelIndex *)QList<QPersistentModelIndex>::end(in_stack_ffffffffffffff50);
  local_20 = (const_iterator)local_28;
  bVar1 = QList<QPersistentModelIndex>::const_iterator::operator!=
                    (&local_18,(const_iterator)local_28);
  if (bVar1) {
    QDebug::QDebug(local_38,(QDebug *)in_RSI);
    QList<QPersistentModelIndex>::const_iterator::operator*(&local_18);
    ::operator<<(in_RDX,in_RCX);
    QDebug::~QDebug(in_RDX);
    QDebug::~QDebug(in_RDX);
    QList<QPersistentModelIndex>::const_iterator::operator++(&local_18);
  }
  while( true ) {
    local_40 = local_20.i;
    bVar1 = QList<QPersistentModelIndex>::const_iterator::operator!=(&local_18,local_20);
    if (!bVar1) break;
    in_stack_ffffffffffffff58 = QDebug::operator<<(this,(char *)t);
    QDebug::QDebug(local_50,in_stack_ffffffffffffff58);
    QList<QPersistentModelIndex>::const_iterator::operator*(&local_18);
    ::operator<<(in_RDX,in_RCX);
    QDebug::~QDebug(in_RDX);
    QDebug::~QDebug(in_RDX);
    QList<QPersistentModelIndex>::const_iterator::operator++(&local_18);
  }
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4f);
  QDebug::QDebug((QDebug *)in_RDI,in_stack_ffffffffffffff58);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)in_stack_ffffffffffffff50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDebug)pSVar2;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}